

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteBlock.cpp
# Opt level: O0

ByteBlock * Js::ByteBlock::New(Recycler *alloc,byte *initialContent,int initialContentSize)

{
  uchar *dst;
  code *pcVar1;
  byte *this;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  Recycler *alloc_00;
  ByteBlock *this_00;
  uchar **ppuVar5;
  TrackAllocData local_50;
  ByteBlock *local_28;
  ByteBlock *newBlock;
  byte *pbStack_18;
  int initialContentSize_local;
  byte *initialContent_local;
  Recycler *alloc_local;
  
  newBlock._4_4_ = initialContentSize;
  pbStack_18 = initialContent;
  initialContent_local = (byte *)alloc;
  if (initialContentSize < 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteBlock.cpp"
                                ,0x29,"(initialContentSize > 0)","Must have valid data size");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this = initialContent_local;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteBlock.cpp"
             ,0x2b);
  alloc_00 = Memory::Recycler::TrackAllocInfo((Recycler *)this,&local_50);
  this_00 = (ByteBlock *)new<Memory::Recycler>(0x10,alloc_00,0x43c4b0);
  ByteBlock(this_00,newBlock._4_4_,(Recycler *)initialContent_local);
  local_28 = this_00;
  if (pbStack_18 != (byte *)0x0) {
    ppuVar5 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                        ((WriteBarrierPtr *)&this_00->m_content);
    dst = *ppuVar5;
    uVar3 = GetLength(local_28);
    js_memcpy_s(dst,(ulong)uVar3,pbStack_18,(long)(int)newBlock._4_4_);
  }
  return local_28;
}

Assistant:

ByteBlock *ByteBlock::New(Recycler *alloc, const byte * initialContent, int initialContentSize)
    {
        // initialContent may be 'null' if no data to copy
        AssertMsg(initialContentSize > 0, "Must have valid data size");

        ByteBlock *newBlock = RecyclerNew(alloc, ByteBlock, initialContentSize, alloc);

        //
        // Copy any optional data into the block:
        // - If initialContent was not provided, the block's contents will be uninitialized.
        //
        if (initialContent != nullptr)
        {
            js_memcpy_s(newBlock->m_content, newBlock->GetLength(), initialContent, initialContentSize);
        }

        return newBlock;
    }